

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O1

void av1_upscale_normative_rows
               (AV1_COMMON *cm,uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int plane,
               int rows)

{
  byte bVar1;
  ushort uVar2;
  aom_bit_depth_t aVar3;
  size_t size;
  size_t size_00;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int *piVar8;
  void *memblk;
  void *memblk_00;
  undefined8 *puVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint8_t *puVar19;
  int iVar20;
  int iVar21;
  int *piVar22;
  undefined8 *puVar23;
  int *piVar24;
  undefined8 *puVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  TileInfo tile_col;
  
  if (plane < 1) {
    bVar26 = false;
  }
  else {
    bVar26 = cm->seq_params->subsampling_x != 0;
  }
  uVar16 = (uint)(1 << bVar26) >> 1;
  iVar14 = (int)(cm->width + uVar16) >> bVar26;
  iVar17 = uVar16 + cm->superres_upscaled_width;
  iVar20 = iVar17 >> bVar26;
  iVar18 = iVar20 - (iVar17 >> 0x1f) >> 1;
  iVar17 = (iVar18 + iVar14 * 0x4000) / iVar20;
  if (0 < (cm->tiles).cols) {
    bVar1 = cm->superres_scale_denominator;
    iVar7 = iVar17 * iVar20 + iVar14 * -0x4000;
    uVar16 = (((iVar14 - iVar20) * 0x2000 + iVar18) / iVar20 -
             ((uint)(iVar7 - (iVar7 >> 0x1f)) >> 1)) + 0x80 & 0x3fff;
    size_00 = (long)rows * 10;
    lVar13 = (long)src_stride;
    size = (long)rows * 5;
    lVar4 = (ulong)(uint)rows * 10;
    lVar5 = lVar13 * 2;
    lVar6 = (ulong)(uint)rows * 5;
    iVar14 = 0;
    do {
      av1_tile_set_col(&tile_col,cm,iVar14);
      iVar7 = tile_col.mi_col_start << (2U - bVar26 & 0x1f);
      iVar15 = tile_col.mi_col_end << (2U - bVar26 & 0x1f);
      iVar11 = iVar7 * (uint)bVar1;
      iVar18 = iVar11 + 7;
      if (-1 < iVar11) {
        iVar18 = iVar11;
      }
      iVar21 = (cm->tiles).cols + -1;
      iVar11 = iVar20;
      if (iVar14 != iVar21) {
        iVar12 = iVar15 * (uint)bVar1;
        iVar11 = iVar12 + 7;
        if (-1 < iVar12) {
          iVar11 = iVar12;
        }
        iVar11 = iVar11 >> 3;
      }
      iVar15 = iVar15 - iVar7;
      puVar19 = src + iVar7;
      iVar11 = iVar11 - (iVar18 >> 3);
      if (cm->seq_params->use_highbitdepth == '\0') {
        piVar22 = (int *)(puVar19 + -5);
        if (iVar14 == 0) {
          memblk = aom_malloc(size);
          if (memblk == (void *)0x0) goto LAB_003a862b;
          if (0 < rows) {
            lVar10 = 0;
            piVar24 = piVar22;
            do {
              *(char *)((long)memblk + lVar10 + 4) = (char)piVar24[1];
              *(int *)((long)memblk + lVar10) = *piVar24;
              iVar7 = (uint)*(byte *)((long)piVar24 + 5) * 0x1010101;
              *piVar24 = iVar7;
              *(char *)(piVar24 + 1) = (char)iVar7;
              lVar10 = lVar10 + 5;
              piVar24 = (int *)((long)piVar24 + lVar13);
            } while (lVar6 != lVar10);
          }
        }
        else {
          memblk = (void *)0x0;
        }
        piVar24 = (int *)(puVar19 + iVar15);
        if (iVar14 == iVar21) {
          memblk_00 = aom_malloc(size);
          if (memblk_00 != (void *)0x0) {
            if (0 < rows) {
              lVar10 = 0;
              piVar8 = piVar24;
              do {
                *(char *)((long)memblk_00 + lVar10 + 4) = (char)piVar8[1];
                *(int *)((long)memblk_00 + lVar10) = *piVar8;
                iVar7 = (uint)*(byte *)((long)piVar8 + -1) * 0x1010101;
                *piVar8 = iVar7;
                *(char *)(piVar8 + 1) = (char)iVar7;
                lVar10 = lVar10 + 5;
                piVar8 = (int *)((long)piVar8 + lVar13);
              } while (lVar6 != lVar10);
            }
            goto LAB_003a8445;
          }
LAB_003a8623:
          aom_free(memblk);
          goto LAB_003a862b;
        }
        memblk_00 = (void *)0x0;
LAB_003a8445:
        (*av1_convolve_horiz_rs)
                  (puVar19 + -1,src_stride,dst + (iVar18 >> 3),dst_stride,iVar11,rows,
                   av1_resize_filter_normative[0],uVar16,iVar17);
        if (iVar14 == 0) {
          if (0 < rows) {
            lVar10 = 0;
            do {
              *(undefined1 *)(piVar22 + 1) = *(undefined1 *)((long)memblk + lVar10 + 4);
              *piVar22 = *(int *)((long)memblk + lVar10);
              lVar10 = lVar10 + 5;
              piVar22 = (int *)((long)piVar22 + lVar13);
            } while (lVar6 != lVar10);
          }
          aom_free(memblk);
        }
        if (iVar14 == iVar21) {
          if (0 < rows) {
            lVar10 = 0;
            do {
              *(undefined1 *)(piVar24 + 1) = *(undefined1 *)((long)memblk_00 + lVar10 + 4);
              *piVar24 = *(int *)((long)memblk_00 + lVar10);
              lVar10 = lVar10 + 5;
              piVar24 = (int *)((long)piVar24 + lVar13);
            } while (lVar6 != lVar10);
          }
          goto LAB_003a8717;
        }
      }
      else {
        aVar3 = cm->seq_params->bit_depth;
        puVar23 = (undefined8 *)((long)puVar19 * 2 + -10);
        if (iVar14 == 0) {
          memblk = aom_malloc(size_00);
          if (memblk != (void *)0x0) {
            if (0 < rows) {
              lVar10 = 0;
              puVar25 = puVar23;
              do {
                *(undefined2 *)((long)memblk + lVar10 + 8) = *(undefined2 *)(puVar25 + 1);
                *(undefined8 *)((long)memblk + lVar10) = *puVar25;
                uVar2 = *(ushort *)((long)puVar25 + 10);
                auVar27 = pshuflw(ZEXT216(uVar2),ZEXT216(uVar2),0);
                *puVar25 = auVar27._0_8_;
                *(ushort *)(puVar25 + 1) = uVar2;
                lVar10 = lVar10 + 10;
                puVar25 = (undefined8 *)((long)puVar25 + lVar5);
              } while (lVar4 != lVar10);
            }
            goto LAB_003a85a1;
          }
LAB_003a862b:
          aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Error upscaling frame");
        }
        else {
          memblk = (void *)0x0;
LAB_003a85a1:
          puVar25 = (undefined8 *)((long)iVar15 * 2 + (long)puVar19 * 2);
          if (iVar14 == iVar21) {
            memblk_00 = aom_malloc(size_00);
            if (memblk_00 == (void *)0x0) goto LAB_003a8623;
            if (0 < rows) {
              lVar10 = 0;
              puVar9 = puVar25;
              do {
                *(undefined2 *)((long)memblk_00 + lVar10 + 8) = *(undefined2 *)(puVar9 + 1);
                *(undefined8 *)((long)memblk_00 + lVar10) = *puVar9;
                uVar2 = *(ushort *)((long)puVar9 + -2);
                auVar27 = pshuflw(ZEXT216(uVar2),ZEXT216(uVar2),0);
                *puVar9 = auVar27._0_8_;
                *(ushort *)(puVar9 + 1) = uVar2;
                lVar10 = lVar10 + 10;
                puVar9 = (undefined8 *)((long)puVar9 + lVar5);
              } while (lVar4 != lVar10);
            }
          }
          else {
            memblk_00 = (void *)0x0;
          }
          (*av1_highbd_convolve_horiz_rs)
                    ((uint16_t *)((long)puVar19 * 2 + -2),src_stride,
                     (uint16_t *)((long)(dst + (iVar18 >> 3)) * 2),dst_stride,iVar11,rows,
                     av1_resize_filter_normative[0],uVar16,iVar17,aVar3);
          if (iVar14 == 0) {
            if (0 < rows) {
              lVar10 = 0;
              do {
                *(undefined2 *)(puVar23 + 1) = *(undefined2 *)((long)memblk + lVar10 + 8);
                *puVar23 = *(undefined8 *)((long)memblk + lVar10);
                lVar10 = lVar10 + 10;
                puVar23 = (undefined8 *)((long)puVar23 + lVar5);
              } while (lVar4 != lVar10);
            }
            aom_free(memblk);
          }
          if (iVar14 == iVar21) {
            if (0 < rows) {
              lVar10 = 0;
              do {
                *(undefined2 *)(puVar25 + 1) = *(undefined2 *)((long)memblk_00 + lVar10 + 8);
                *puVar25 = *(undefined8 *)((long)memblk_00 + lVar10);
                lVar10 = lVar10 + 10;
                puVar25 = (undefined8 *)((long)puVar25 + lVar5);
              } while (lVar4 != lVar10);
            }
LAB_003a8717:
            aom_free(memblk_00);
          }
        }
      }
      uVar16 = uVar16 + iVar15 * -0x4000 + iVar11 * iVar17;
      iVar14 = iVar14 + 1;
    } while (iVar14 < (cm->tiles).cols);
  }
  return;
}

Assistant:

void av1_upscale_normative_rows(const AV1_COMMON *cm, const uint8_t *src,
                                int src_stride, uint8_t *dst, int dst_stride,
                                int plane, int rows) {
  const int is_uv = (plane > 0);
  const int ss_x = is_uv && cm->seq_params->subsampling_x;
  const int downscaled_plane_width = ROUND_POWER_OF_TWO(cm->width, ss_x);
  const int upscaled_plane_width =
      ROUND_POWER_OF_TWO(cm->superres_upscaled_width, ss_x);
  const int superres_denom = cm->superres_scale_denominator;

  TileInfo tile_col;
  const int32_t x_step_qn = av1_get_upscale_convolve_step(
      downscaled_plane_width, upscaled_plane_width);
  int32_t x0_qn = get_upscale_convolve_x0(downscaled_plane_width,
                                          upscaled_plane_width, x_step_qn);

  for (int j = 0; j < cm->tiles.cols; j++) {
    av1_tile_set_col(&tile_col, cm, j);
    // Determine the limits of this tile column in both the source
    // and destination images.
    // Note: The actual location which we start sampling from is
    // (downscaled_x0 - 1 + (x0_qn/2^14)), and this quantity increases
    // by exactly dst_width * (x_step_qn/2^14) pixels each iteration.
    const int downscaled_x0 = tile_col.mi_col_start << (MI_SIZE_LOG2 - ss_x);
    const int downscaled_x1 = tile_col.mi_col_end << (MI_SIZE_LOG2 - ss_x);
    const int src_width = downscaled_x1 - downscaled_x0;

    const int upscaled_x0 = (downscaled_x0 * superres_denom) / SCALE_NUMERATOR;
    int upscaled_x1;
    if (j == cm->tiles.cols - 1) {
      // Note that we can't just use AOMMIN here - due to rounding,
      // (downscaled_x1 * superres_denom) / SCALE_NUMERATOR may be less than
      // upscaled_plane_width.
      upscaled_x1 = upscaled_plane_width;
    } else {
      upscaled_x1 = (downscaled_x1 * superres_denom) / SCALE_NUMERATOR;
    }

    const uint8_t *const src_ptr = src + downscaled_x0;
    uint8_t *const dst_ptr = dst + upscaled_x0;
    const int dst_width = upscaled_x1 - upscaled_x0;

    const int pad_left = (j == 0);
    const int pad_right = (j == cm->tiles.cols - 1);

    bool success;
#if CONFIG_AV1_HIGHBITDEPTH
    if (cm->seq_params->use_highbitdepth)
      success = highbd_upscale_normative_rect(
          src_ptr, rows, src_width, src_stride, dst_ptr, rows, dst_width,
          dst_stride, x_step_qn, x0_qn, pad_left, pad_right,
          cm->seq_params->bit_depth);
    else
      success = upscale_normative_rect(src_ptr, rows, src_width, src_stride,
                                       dst_ptr, rows, dst_width, dst_stride,
                                       x_step_qn, x0_qn, pad_left, pad_right);
#else
    success = upscale_normative_rect(src_ptr, rows, src_width, src_stride,
                                     dst_ptr, rows, dst_width, dst_stride,
                                     x_step_qn, x0_qn, pad_left, pad_right);
#endif
    if (!success) {
      aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                         "Error upscaling frame");
    }
    // Update the fractional pixel offset to prepare for the next tile column.
    x0_qn += (dst_width * x_step_qn) - (src_width << RS_SCALE_SUBPEL_BITS);
  }
}